

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

int Iso_ManNegEdgeNum(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig_local;
  
  local_28 = 0;
  if (pAig->nComplEdges < 1) {
    for (local_24 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_24 < iVar1; local_24 = local_24 + 1)
    {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_24);
      if (pObj_00 != (Aig_Obj_t *)0x0) {
        iVar1 = Aig_ObjIsNode(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsCo(pObj_00);
          if (iVar1 != 0) {
            iVar1 = Aig_ObjFaninC0(pObj_00);
            local_28 = iVar1 + local_28;
          }
        }
        else {
          iVar1 = Aig_ObjFaninC0(pObj_00);
          iVar2 = Aig_ObjFaninC1(pObj_00);
          local_28 = iVar2 + iVar1 + local_28;
        }
      }
    }
    pAig->nComplEdges = local_28;
    pAig_local._4_4_ = local_28;
  }
  else {
    pAig_local._4_4_ = pAig->nComplEdges;
  }
  return pAig_local._4_4_;
}

Assistant:

int Iso_ManNegEdgeNum( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    if ( pAig->nComplEdges > 0 )
        return pAig->nComplEdges;
    Aig_ManForEachObj( pAig, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
        {
            Counter += Aig_ObjFaninC0(pObj);
            Counter += Aig_ObjFaninC1(pObj);
        }
        else if ( Aig_ObjIsCo(pObj) )
            Counter += Aig_ObjFaninC0(pObj);
    return (pAig->nComplEdges = Counter);
}